

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

int absl::lts_20250127::strings_internal::Compare<84,84>(BigUnsigned<84> *lhs,BigUnsigned<84> *rhs)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint32_t rhs_word;
  uint32_t lhs_word;
  int i;
  uint32_t local_24;
  BigUnsigned<84> *pBStack_20;
  int limit;
  BigUnsigned<84> *rhs_local;
  BigUnsigned<84> *lhs_local;
  
  pBStack_20 = rhs;
  rhs_local = lhs;
  i = BigUnsigned<84>::size(lhs);
  lhs_word = BigUnsigned<84>::size(pBStack_20);
  puVar3 = (uint32_t *)std::max<int>(&i,(int *)&lhs_word);
  local_24 = *puVar3;
  rhs_word = local_24;
  while( true ) {
    rhs_word = rhs_word - 1;
    if ((int)rhs_word < 0) {
      return 0;
    }
    uVar1 = BigUnsigned<84>::GetWord(rhs_local,rhs_word);
    uVar2 = BigUnsigned<84>::GetWord(pBStack_20,rhs_word);
    if (uVar1 < uVar2) break;
    if (uVar2 < uVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

int Compare(const BigUnsigned<N>& lhs, const BigUnsigned<M>& rhs) {
  int limit = (std::max)(lhs.size(), rhs.size());
  for (int i = limit - 1; i >= 0; --i) {
    const uint32_t lhs_word = lhs.GetWord(i);
    const uint32_t rhs_word = rhs.GetWord(i);
    if (lhs_word < rhs_word) {
      return -1;
    } else if (lhs_word > rhs_word) {
      return 1;
    }
  }
  return 0;
}